

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionObservationHistory.cpp
# Opt level: O0

string * __thiscall
JointActionObservationHistory::SoftPrint_abi_cxx11_(JointActionObservationHistory *this)

{
  ostream *poVar1;
  undefined8 uVar2;
  JointAction *pJVar3;
  JointObservation *pJVar4;
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  undefined4 in_stack_fffffffffffffd98;
  Index in_stack_fffffffffffffd9c;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffda0;
  PlanningUnitMADPDiscrete *this_00;
  string local_208 [32];
  string local_1e8 [48];
  string local_1b8 [32];
  stringstream local_198 [16];
  JointActionObservationHistory *in_stack_ffffffffffffffe8;
  
  std::__cxx11::stringstream::stringstream(local_198);
  if (*(long *)(in_RSI + 0x18) != 0) {
    if (*(long *)(in_RSI + 8) == 0) {
      poVar1 = std::operator<<((ostream *)&stack0xfffffffffffffe78,
                               "JointActionObservationHistory:Print() -Warning:_m_pred != ");
      poVar1 = std::operator<<(poVar1,"null, but lenght <= 1 !");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      uVar2 = __cxa_allocate_exception(0x28);
      E::E((E *)in_stack_fffffffffffffda0,
           (stringstream *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      __cxa_throw(uVar2,&E::typeinfo,E::~E);
    }
    SoftPrint_abi_cxx11_(in_stack_ffffffffffffffe8);
    std::operator<<((ostream *)&stack0xfffffffffffffe78,local_1b8);
    std::__cxx11::string::~string(local_1b8);
    std::operator<<((ostream *)&stack0xfffffffffffffe78,", ");
  }
  if (*(long *)(in_RSI + 8) == 0) {
    std::operator<<((ostream *)&stack0xfffffffffffffe78,"<EMPTY>");
  }
  else {
    std::operator<<((ostream *)&stack0xfffffffffffffe78,"< ");
    pJVar3 = PlanningUnitMADPDiscrete::GetJointAction
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
    (*pJVar3->_vptr_JointAction[4])(local_1e8);
    std::operator<<((ostream *)&stack0xfffffffffffffe78,local_1e8);
    std::__cxx11::string::~string(local_1e8);
    std::operator<<((ostream *)&stack0xfffffffffffffe78,", ");
    this_00 = (PlanningUnitMADPDiscrete *)&stack0xfffffffffffffe78;
    pJVar4 = PlanningUnitMADPDiscrete::GetJointObservation(this_00,in_stack_fffffffffffffd9c);
    (*pJVar4->_vptr_JointObservation[4])(local_208);
    std::operator<<((ostream *)this_00,local_208);
    std::__cxx11::string::~string(local_208);
    std::operator<<((ostream *)&stack0xfffffffffffffe78," >");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string JointActionObservationHistory::SoftPrint() const
{
    stringstream ss;
    if(_m_pred != 0)
    {
        if(_m_length >= 1)
        {
            ss << _m_pred->SoftPrint();
            ss << ", ";
        }
        else
        {
            ss << "JointActionObservationHistory:Print() -Warning:_m_pred != "
                << "null, but lenght <= 1 !"<<endl;
            throw E(ss);
        }
    }

    if (_m_length >= 1) 
    {
        ss << "< ";    
        ss << _m_planningUnitMADPDiscrete->GetJointAction(_m_jaI)->SoftPrintBrief();
        ss << ", ";    
        ss << _m_planningUnitMADPDiscrete->GetJointObservation(_m_joI)->SoftPrintBrief();
        ss << " >";    
    }
    else
        ss << "<EMPTY>";


    return(ss.str());

}